

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.cpp
# Opt level: O0

void sha512_Raw(sha2_byte *data,size_t len,uint8_t *digest)

{
  undefined1 local_f0 [8];
  SHA512_CTX context;
  uint8_t *digest_local;
  size_t len_local;
  sha2_byte *data_local;
  
  context.buffer[0xf] = (uint64_t)digest;
  sha512_Init((SHA512_CTX *)local_f0);
  sha512_Update((SHA512_CTX *)local_f0,data,len);
  sha512_Final((SHA512_CTX *)local_f0,(sha2_byte *)context.buffer[0xf]);
  return;
}

Assistant:

void sha512_Raw(const sha2_byte* data, size_t len, uint8_t digest[SHA512_DIGEST_LENGTH]) {
    trezor::SHA512_CTX	context;
	sha512_Init(&context);
	sha512_Update(&context, data, len);
	sha512_Final(&context, digest);
}